

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
Command::Command(Command *this,string *command,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *parameters)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  string *command_local;
  Command *this_local;
  
  this->_vptr_Command = (_func_int **)&PTR__Command_00117cd0;
  std::__cxx11::string::string((string *)&this->_command,(string *)command);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_parameters,parameters);
  return;
}

Assistant:

Command::Command(const std::string& command, const std::vector<std::string>& parameters)
    : _command(command), _parameters(parameters)
{ }